

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool server::restorescore(clientinfo *ci)

{
  savedscore *psVar1;
  
  psVar1 = findscore(ci,false);
  if (psVar1 != (savedscore *)0x0) {
    (ci->state).frags = psVar1->frags;
    (ci->state).flags = psVar1->flags;
    (ci->state).deaths = psVar1->deaths;
    (ci->state).teamkills = psVar1->teamkills;
    (ci->state).shotdamage = psVar1->shotdamage;
    (ci->state).damage = psVar1->damage;
    (ci->state).timeplayed = psVar1->timeplayed;
    (ci->state).effectiveness = psVar1->effectiveness;
  }
  return psVar1 != (savedscore *)0x0;
}

Assistant:

bool restorescore(clientinfo *ci)
    {
        //if(ci->local) return false;
        savedscore *sc = findscore(ci, false);
        if(sc)
        {
            sc->restore(ci->state);
            return true;
        }
        return false;
    }